

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.hpp
# Opt level: O0

void libtorrent::aux::
     random_shuffle<libtorrent::span<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>>>
               (span<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
                *range)

{
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *__first;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *psVar1;
  index_type iVar2;
  mt19937 *__g;
  span<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_> *range_local;
  
  __first = span<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>::
            data(range);
  psVar1 = span<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>::data
                     (range);
  iVar2 = span<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>::size
                    (range);
  __g = random_engine();
  ::std::
  shuffle<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>*,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>&>
            (__first,psVar1 + iVar2,__g);
  return;
}

Assistant:

void random_shuffle(Range& range)
	{
#ifdef TORRENT_BUILD_SIMULATOR
		// in simulations, we want all shuffles to be deterministic (as long as
		// the random engine is deterministic
		if (range.size() == 0) return;
		for (auto i = range.size() - 1; i > 0; --i) {
			auto const other = random(std::uint32_t(i));
			if (i == other) continue;
			using std::swap;
			swap(range.data()[i], range.data()[other]);
		}
#else
		std::shuffle(range.data(), range.data() + range.size(), random_engine());
#endif
	}